

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * unpack14_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0x3fff) + base;
  out[1] = (*in >> 0xe & 0x3fff) + base;
  uVar1 = *in;
  out[2] = uVar1 >> 0x1c;
  out[2] = (uVar1 >> 0x1c) + base + (in[1] & 0x3ff) * 0x10;
  out[3] = (in[1] >> 10 & 0x3fff) + base;
  uVar1 = in[1];
  out[4] = uVar1 >> 0x18;
  out[4] = (uVar1 >> 0x18) + base + (in[2] & 0x3f) * 0x100;
  out[5] = (in[2] >> 6 & 0x3fff) + base;
  uVar1 = in[2];
  out[6] = uVar1 >> 0x14;
  out[6] = (uVar1 >> 0x14) + base + (in[3] & 3) * 0x1000;
  out[7] = (in[3] >> 2 & 0x3fff) + base;
  out[8] = (*(ushort *)((long)in + 0xe) & 0x3fff) + base;
  uVar1 = in[3];
  out[9] = uVar1 >> 0x1e;
  out[9] = (uVar1 >> 0x1e) + base + (in[4] & 0xfff) * 4;
  out[10] = (in[4] >> 0xc & 0x3fff) + base;
  uVar1 = in[4];
  out[0xb] = uVar1 >> 0x1a;
  out[0xb] = (uVar1 >> 0x1a) + base + (in[5] & 0xff) * 0x40;
  out[0xc] = (in[5] >> 8 & 0x3fff) + base;
  uVar1 = in[5];
  out[0xd] = uVar1 >> 0x16;
  out[0xd] = (uVar1 >> 0x16) + base + (in[6] & 0xf) * 0x400;
  out[0xe] = (in[6] >> 4 & 0x3fff) + base;
  out[0xf] = (in[6] >> 0x12) + base;
  return in + 7;
}

Assistant:

uint32_t * unpack14_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 14 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  14  )   % (1U << 14 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 10 ))<<( 14 - 10 );
    *out += base;
    out++;
    *out = ( (*in) >>  10  )   % (1U << 14 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 6 ))<<( 14 - 6 );
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 14 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 2 ))<<( 14 - 2 );
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   % (1U << 14 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  )   % (1U << 14 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 14 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 14 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 14 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 14 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  22  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 14 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 14 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  18  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}